

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  short sVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  parasail_result_t *ppVar10;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *__dest;
  __m128i *ptr_00;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  __m128i *palVar14;
  uint uVar15;
  longlong extraout_RDX;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong size;
  int iVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  ushort uVar26;
  short sVar27;
  short sVar28;
  ushort uVar29;
  undefined4 uVar30;
  ushort uVar48;
  ushort uVar51;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  undefined1 auVar32 [16];
  undefined4 uVar31;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  __m128i alVar37;
  ushort uVar45;
  ushort uVar57;
  undefined1 auVar38 [16];
  short sVar46;
  short sVar49;
  short sVar52;
  short sVar58;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  ushort uVar47;
  ushort uVar50;
  ushort uVar53;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ushort uVar59;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar68 [16];
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  undefined1 auVar77 [16];
  ushort uVar78;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  undefined1 auVar79 [16];
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  ushort uVar102;
  __m128i c;
  uint local_1b0;
  int local_1ac;
  ushort local_148;
  ushort uStack_146;
  ushort local_c8;
  ushort uStack_c6;
  ushort local_78;
  ushort uStack_76;
  size_t len;
  undefined1 auVar39 [16];
  short sVar60;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_scan_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_table_scan_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_scan_profile_sse2_128_16_cold_6();
      }
      else {
        uVar23 = profile->s1Len;
        uVar9 = (ulong)uVar23;
        if ((int)uVar23 < 1) {
          parasail_sw_table_scan_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_scan_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_table_scan_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_table_scan_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_table_scan_profile_sse2_128_16_cold_1();
        }
        else {
          uVar19 = uVar9 + 7;
          iVar8 = -open;
          iVar13 = ppVar4->min;
          iVar21 = -iVar13;
          if (iVar13 != iVar8 && SBORROW4(iVar13,iVar8) == iVar13 + open < 0) {
            iVar21 = open;
          }
          iVar13 = ppVar4->max;
          ppVar10 = parasail_result_new_table1((uint)uVar19 & 0x7ffffff8,s2Len);
          if (ppVar10 != (parasail_result_t *)0x0) {
            size = uVar19 >> 3;
            ppVar10->flag = ppVar10->flag | 0x8220404;
            b = parasail_memalign___m128i(0x10,size);
            ptr = parasail_memalign___m128i(0x10,size);
            b_00 = parasail_memalign___m128i(0x10,size);
            __dest = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            if (ptr_00 != (__m128i *)0x0 &&
                ((__dest != (__m128i *)0x0 && b_00 != (__m128i *)0x0) &&
                (ptr != (__m128i *)0x0 && b != (__m128i *)0x0))) {
              auVar32 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar30 = auVar32._0_4_;
              auVar32 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar31 = auVar32._0_4_;
              local_1b0 = iVar21 - 0x7fff;
              auVar33 = pshuflw(ZEXT416(local_1b0),ZEXT416(local_1b0),0);
              auVar32 = ZEXT416(CONCAT22((short)((uint)iVar8 >> 0x10),0x7ffe - (short)iVar13));
              auVar34 = pshuflw(auVar32,auVar32,0);
              uVar12 = local_1b0 & 0xffff;
              len = (size_t)uVar12;
              uVar20 = (uint)size;
              alVar37[1]._0_4_ = -(gap * uVar20);
              auVar32 = pshuflw(ZEXT416((uint)alVar37[1]),ZEXT416((uint)alVar37[1]),0);
              uVar15 = auVar32._0_4_;
              auVar36._0_8_ = CONCAT44(uVar15,uVar15);
              auVar36._8_4_ = uVar15;
              auVar36._12_4_ = uVar15;
              auVar35._0_8_ = auVar36._0_8_ << 0x10;
              auVar35._8_8_ = auVar36._8_8_ << 0x10 | (ulong)(uVar15 >> 0x10);
              auVar36 = paddsw(auVar35,ZEXT416(uVar12));
              alVar37[0] = size;
              alVar37[1]._4_4_ = 0;
              parasail_memset___m128i(b_00,alVar37,len);
              c[1] = extraout_RDX;
              c[0] = size;
              parasail_memset___m128i(b,c,len);
              auVar32._4_4_ = uVar31;
              auVar32._0_4_ = uVar31;
              auVar32._8_4_ = uVar31;
              auVar32._12_4_ = uVar31;
              auVar77._4_4_ = uVar30;
              auVar77._0_4_ = uVar30;
              auVar77._8_4_ = uVar30;
              auVar77._12_4_ = uVar30;
              alVar37 = (__m128i)psubsw((undefined1  [16])0x0,auVar77);
              palVar14 = ptr_00 + (uVar20 - 1);
              uVar11 = size;
              do {
                *palVar14 = alVar37;
                alVar37 = (__m128i)psubsw((undefined1  [16])alVar37,auVar32);
                palVar14 = palVar14 + -1;
                iVar13 = (int)uVar11;
                uVar15 = iVar13 - 1;
                uVar11 = (ulong)uVar15;
              } while (uVar15 != 0 && 0 < iVar13);
              uVar11 = 1;
              if (1 < s2Len) {
                uVar11 = (ulong)(uint)s2Len;
              }
              lVar24 = (ulong)(uVar20 + (uVar20 == 0)) << 4;
              lVar16 = size * (uint)s2Len;
              lVar22 = 0;
              uVar25 = 0;
              local_148 = auVar33._0_2_;
              uStack_146 = auVar33._2_2_;
              local_c8 = auVar34._0_2_;
              uStack_c6 = auVar34._2_2_;
              local_1ac = 0;
              uVar78 = local_148;
              uVar80 = uStack_146;
              uVar81 = local_148;
              uVar82 = uStack_146;
              uVar83 = local_148;
              uVar84 = uStack_146;
              uVar85 = local_148;
              uVar86 = uStack_146;
              local_78 = local_148;
              uStack_76 = uStack_146;
              uVar29 = local_148;
              uVar47 = uStack_146;
              uVar50 = local_148;
              uVar53 = uStack_146;
              uVar66 = local_148;
              uVar67 = uStack_146;
              uVar95 = local_148;
              uVar96 = uStack_146;
              uVar97 = local_148;
              uVar98 = uStack_146;
              uVar99 = local_148;
              uVar100 = uStack_146;
              uVar101 = local_148;
              uVar102 = uStack_146;
              uVar87 = local_c8;
              uVar88 = uStack_c6;
              uVar89 = local_c8;
              uVar90 = uStack_c6;
              uVar91 = local_c8;
              uVar92 = uStack_c6;
              uVar93 = local_c8;
              uVar94 = uStack_c6;
              do {
                iVar13 = ppVar4->mapper[(byte)s2[uVar25]];
                uVar7 = b_00[uVar20 - 1][0];
                auVar33._0_8_ = uVar7 << 0x10;
                auVar33._8_8_ = b_00[uVar20 - 1][1] << 0x10 | uVar7 >> 0x30;
                lVar17 = 0;
                auVar34 = (undefined1  [16])0x0;
                uVar26 = local_148;
                uVar45 = uStack_146;
                uVar48 = local_148;
                uVar51 = uStack_146;
                uVar54 = local_148;
                uVar55 = uStack_146;
                uVar56 = local_148;
                uVar57 = uStack_146;
                do {
                  auVar35 = *(undefined1 (*) [16])((long)*b_00 + lVar17);
                  auVar68 = paddsw(auVar33,*(undefined1 (*) [16])
                                            ((long)pvVar3 + lVar17 + size * (long)iVar13 * 0x10));
                  auVar33 = paddsw(auVar34,*(undefined1 (*) [16])((long)*ptr_00 + lVar17));
                  auVar34 = psubsw(*(undefined1 (*) [16])((long)*b + lVar17),auVar32);
                  sVar60 = auVar33._0_2_;
                  uVar26 = (ushort)((short)uVar26 < sVar60) * sVar60 |
                           ((short)uVar26 >= sVar60) * uVar26;
                  sVar60 = auVar33._2_2_;
                  uVar45 = (ushort)((short)uVar45 < sVar60) * sVar60 |
                           ((short)uVar45 >= sVar60) * uVar45;
                  sVar60 = auVar33._4_2_;
                  uVar48 = (ushort)((short)uVar48 < sVar60) * sVar60 |
                           ((short)uVar48 >= sVar60) * uVar48;
                  sVar60 = auVar33._6_2_;
                  uVar51 = (ushort)((short)uVar51 < sVar60) * sVar60 |
                           ((short)uVar51 >= sVar60) * uVar51;
                  sVar60 = auVar33._8_2_;
                  uVar54 = (ushort)((short)uVar54 < sVar60) * sVar60 |
                           ((short)uVar54 >= sVar60) * uVar54;
                  sVar60 = auVar33._10_2_;
                  uVar55 = (ushort)((short)uVar55 < sVar60) * sVar60 |
                           ((short)uVar55 >= sVar60) * uVar55;
                  sVar60 = auVar33._12_2_;
                  uVar56 = (ushort)((short)uVar56 < sVar60) * sVar60 |
                           ((short)uVar56 >= sVar60) * uVar56;
                  sVar60 = auVar33._14_2_;
                  uVar57 = (ushort)((short)uVar57 < sVar60) * sVar60 |
                           ((short)uVar57 >= sVar60) * uVar57;
                  auVar33 = psubsw(auVar35,auVar77);
                  sVar60 = auVar34._0_2_;
                  sVar28 = auVar33._0_2_;
                  uVar69 = (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar34._2_2_;
                  sVar28 = auVar33._2_2_;
                  uVar70 = (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar34._4_2_;
                  sVar28 = auVar33._4_2_;
                  uVar71 = (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar34._6_2_;
                  sVar28 = auVar33._6_2_;
                  uVar72 = (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar34._8_2_;
                  sVar28 = auVar33._8_2_;
                  uVar73 = (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar34._10_2_;
                  sVar28 = auVar33._10_2_;
                  uVar74 = (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar34._12_2_;
                  sVar28 = auVar33._12_2_;
                  sVar58 = auVar33._14_2_;
                  uVar75 = (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar34._14_2_;
                  uVar76 = (ushort)(sVar58 < sVar60) * sVar60 | (ushort)(sVar58 >= sVar60) * sVar58;
                  sVar60 = auVar68._0_2_;
                  uVar59 = (sVar60 < (short)uVar69) * uVar69 |
                           (ushort)(sVar60 >= (short)uVar69) * sVar60;
                  sVar60 = auVar68._2_2_;
                  uVar63 = (sVar60 < (short)uVar70) * uVar70 |
                           (ushort)(sVar60 >= (short)uVar70) * sVar60;
                  sVar60 = auVar68._4_2_;
                  uVar64 = (sVar60 < (short)uVar71) * uVar71 |
                           (ushort)(sVar60 >= (short)uVar71) * sVar60;
                  sVar60 = auVar68._6_2_;
                  uVar65 = (sVar60 < (short)uVar72) * uVar72 |
                           (ushort)(sVar60 >= (short)uVar72) * sVar60;
                  auVar34._0_8_ = CONCAT26(uVar65,CONCAT24(uVar64,CONCAT22(uVar63,uVar59)));
                  sVar60 = auVar68._8_2_;
                  auVar34._8_2_ =
                       (sVar60 < (short)uVar73) * uVar73 |
                       (ushort)(sVar60 >= (short)uVar73) * sVar60;
                  sVar60 = auVar68._10_2_;
                  auVar34._10_2_ =
                       (sVar60 < (short)uVar74) * uVar74 |
                       (ushort)(sVar60 >= (short)uVar74) * sVar60;
                  sVar60 = auVar68._12_2_;
                  sVar28 = auVar68._14_2_;
                  auVar34._12_2_ =
                       (sVar60 < (short)uVar75) * uVar75 |
                       (ushort)(sVar60 >= (short)uVar75) * sVar60;
                  auVar34._14_2_ =
                       (sVar28 < (short)uVar76) * uVar76 |
                       (ushort)(sVar28 >= (short)uVar76) * sVar28;
                  puVar1 = (ushort *)((long)*b + lVar17);
                  *puVar1 = uVar69;
                  puVar1[1] = uVar70;
                  puVar1[2] = uVar71;
                  puVar1[3] = uVar72;
                  puVar1[4] = uVar73;
                  puVar1[5] = uVar74;
                  puVar1[6] = uVar75;
                  puVar1[7] = uVar76;
                  *(undefined1 (*) [16])((long)*ptr + lVar17) = auVar34;
                  lVar17 = lVar17 + 0x10;
                  auVar33 = auVar35;
                } while (lVar24 != lVar17);
                auVar61._0_8_ = auVar34._0_8_ << 0x10;
                auVar61._8_8_ = auVar34._8_8_ << 0x10 | (ulong)uVar65;
                auVar33 = paddsw((undefined1  [16])*ptr_00,auVar61);
                sVar60 = auVar33._0_2_;
                auVar68._0_2_ =
                     (ushort)((short)uVar26 < sVar60) * sVar60 | ((short)uVar26 >= sVar60) * uVar26;
                sVar60 = auVar33._2_2_;
                auVar68._2_2_ =
                     (ushort)((short)uVar45 < sVar60) * sVar60 | ((short)uVar45 >= sVar60) * uVar45;
                sVar60 = auVar33._4_2_;
                auVar68._4_2_ =
                     (ushort)((short)uVar48 < sVar60) * sVar60 | ((short)uVar48 >= sVar60) * uVar48;
                sVar60 = auVar33._6_2_;
                auVar68._6_2_ =
                     (ushort)((short)uVar51 < sVar60) * sVar60 | ((short)uVar51 >= sVar60) * uVar51;
                sVar60 = auVar33._8_2_;
                auVar68._8_2_ =
                     (ushort)((short)uVar54 < sVar60) * sVar60 | ((short)uVar54 >= sVar60) * uVar54;
                sVar60 = auVar33._10_2_;
                auVar68._10_2_ =
                     (ushort)((short)uVar55 < sVar60) * sVar60 | ((short)uVar55 >= sVar60) * uVar55;
                sVar60 = auVar33._12_2_;
                auVar68._12_2_ =
                     (ushort)((short)uVar56 < sVar60) * sVar60 | ((short)uVar56 >= sVar60) * uVar56;
                sVar60 = auVar33._14_2_;
                auVar68._14_2_ =
                     (ushort)((short)uVar57 < sVar60) * sVar60 | ((short)uVar57 >= sVar60) * uVar57;
                iVar13 = 6;
                do {
                  auVar38._0_8_ = auVar68._0_8_ << 0x10;
                  auVar38._8_8_ = auVar68._8_8_ << 0x10 | auVar68._0_8_ >> 0x30;
                  auVar33 = paddsw(auVar38,auVar36);
                  sVar60 = auVar68._0_2_;
                  sVar27 = auVar33._0_2_;
                  sVar28 = auVar68._2_2_;
                  sVar46 = auVar33._2_2_;
                  sVar58 = auVar68._4_2_;
                  sVar49 = auVar33._4_2_;
                  sVar6 = auVar68._6_2_;
                  sVar52 = auVar33._6_2_;
                  uVar26 = (ushort)(sVar52 < sVar6) * sVar6 | (ushort)(sVar52 >= sVar6) * sVar52;
                  auVar39._0_8_ =
                       CONCAT26(uVar26,CONCAT24((ushort)(sVar49 < sVar58) * sVar58 |
                                                (ushort)(sVar49 >= sVar58) * sVar49,
                                                CONCAT22((ushort)(sVar46 < sVar28) * sVar28 |
                                                         (ushort)(sVar46 >= sVar28) * sVar46,
                                                         (ushort)(sVar27 < sVar60) * sVar60 |
                                                         (ushort)(sVar27 >= sVar60) * sVar27)));
                  sVar60 = auVar68._8_2_;
                  sVar28 = auVar33._8_2_;
                  auVar39._8_2_ =
                       (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar68._10_2_;
                  sVar28 = auVar33._10_2_;
                  auVar39._10_2_ =
                       (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar68._12_2_;
                  sVar28 = auVar33._12_2_;
                  sVar58 = auVar33._14_2_;
                  auVar39._12_2_ =
                       (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar68._14_2_;
                  auVar39._14_2_ =
                       (ushort)(sVar58 < sVar60) * sVar60 | (ushort)(sVar58 >= sVar60) * sVar58;
                  iVar13 = iVar13 + -1;
                  auVar68 = auVar39;
                } while (iVar13 != 0);
                auVar40._0_8_ = auVar39._0_8_ << 0x10;
                auVar40._8_8_ = auVar39._8_8_ << 0x10 | (ulong)uVar26;
                auVar41 = paddsw(auVar40,ZEXT416(uVar12));
                sVar60 = (-1 < (short)uVar59) * uVar59;
                sVar49 = (-1 < (short)uVar63) * uVar63;
                sVar46 = (-1 < auVar61._0_8_) * uVar64;
                sVar27 = (-1 < (short)uVar65) * uVar65;
                sVar6 = (-1 < (short)auVar34._8_2_) * auVar34._8_2_;
                sVar58 = (-1 < (short)auVar34._10_2_) * auVar34._10_2_;
                sVar28 = (-1 < (long)auVar61._8_8_) * auVar34._12_2_;
                sVar52 = auVar41._2_2_;
                auVar62._2_2_ =
                     (ushort)(sVar60 < sVar52) * sVar52 | (ushort)(sVar60 >= sVar52) * sVar60;
                auVar62._0_2_ = (ushort)(0 < auVar41._0_2_) * auVar41._0_2_;
                sVar60 = auVar41._4_2_;
                auVar62._4_2_ =
                     (ushort)(sVar49 < sVar60) * sVar60 | (ushort)(sVar49 >= sVar60) * sVar49;
                sVar60 = auVar41._6_2_;
                auVar62._6_2_ =
                     (ushort)(sVar46 < sVar60) * sVar60 | (ushort)(sVar46 >= sVar60) * sVar46;
                sVar60 = auVar41._8_2_;
                auVar62._8_2_ =
                     (ushort)(sVar27 < sVar60) * sVar60 | (ushort)(sVar27 >= sVar60) * sVar27;
                sVar60 = auVar41._10_2_;
                auVar62._10_2_ =
                     (ushort)(sVar6 < sVar60) * sVar60 | (ushort)(sVar6 >= sVar60) * sVar6;
                sVar60 = auVar41._12_2_;
                auVar62._12_2_ =
                     (ushort)(sVar58 < sVar60) * sVar60 | (ushort)(sVar58 >= sVar60) * sVar58;
                sVar60 = auVar41._14_2_;
                auVar62._14_2_ =
                     (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                lVar18 = 0;
                lVar17 = lVar22;
                do {
                  auVar33 = psubsw(auVar41,auVar32);
                  auVar34 = psubsw(auVar62,auVar77);
                  sVar60 = auVar34._0_2_;
                  sVar28 = auVar33._0_2_;
                  auVar41._0_2_ =
                       (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar34._2_2_;
                  sVar28 = auVar33._2_2_;
                  auVar41._2_2_ =
                       (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar34._4_2_;
                  sVar28 = auVar33._4_2_;
                  auVar41._4_2_ =
                       (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar34._6_2_;
                  sVar28 = auVar33._6_2_;
                  auVar41._6_2_ =
                       (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar34._8_2_;
                  sVar28 = auVar33._8_2_;
                  auVar41._8_2_ =
                       (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar34._10_2_;
                  sVar28 = auVar33._10_2_;
                  auVar41._10_2_ =
                       (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar34._12_2_;
                  sVar28 = auVar33._12_2_;
                  sVar58 = auVar33._14_2_;
                  auVar41._12_2_ =
                       (ushort)(sVar28 < sVar60) * sVar60 | (ushort)(sVar28 >= sVar60) * sVar28;
                  sVar60 = auVar34._14_2_;
                  auVar41._14_2_ =
                       (ushort)(sVar58 < sVar60) * sVar60 | (ushort)(sVar58 >= sVar60) * sVar58;
                  psVar2 = (short *)((long)*ptr + lVar18);
                  sVar60 = *psVar2;
                  sVar28 = psVar2[1];
                  sVar58 = psVar2[2];
                  sVar6 = psVar2[3];
                  sVar27 = psVar2[4];
                  sVar46 = psVar2[5];
                  sVar49 = psVar2[6];
                  sVar52 = psVar2[7];
                  uVar45 = (sVar60 < (short)auVar41._0_2_) * auVar41._0_2_ |
                           (ushort)(sVar60 >= (short)auVar41._0_2_) * sVar60;
                  uVar48 = (sVar28 < (short)auVar41._2_2_) * auVar41._2_2_ |
                           (ushort)(sVar28 >= (short)auVar41._2_2_) * sVar28;
                  uVar51 = (sVar58 < (short)auVar41._4_2_) * auVar41._4_2_ |
                           (ushort)(sVar58 >= (short)auVar41._4_2_) * sVar58;
                  uVar54 = (sVar6 < (short)auVar41._6_2_) * auVar41._6_2_ |
                           (ushort)(sVar6 >= (short)auVar41._6_2_) * sVar6;
                  uVar26 = (sVar27 < (short)auVar41._8_2_) * auVar41._8_2_ |
                           (ushort)(sVar27 >= (short)auVar41._8_2_) * sVar27;
                  uVar57 = (sVar46 < (short)auVar41._10_2_) * auVar41._10_2_ |
                           (ushort)(sVar46 >= (short)auVar41._10_2_) * sVar46;
                  uVar56 = (sVar49 < (short)auVar41._12_2_) * auVar41._12_2_ |
                           (ushort)(sVar49 >= (short)auVar41._12_2_) * sVar49;
                  uVar55 = (sVar52 < (short)auVar41._14_2_) * auVar41._14_2_ |
                           (ushort)(sVar52 >= (short)auVar41._14_2_) * sVar52;
                  uVar45 = (-1 < (short)uVar45) * uVar45;
                  uVar48 = (-1 < (short)uVar48) * uVar48;
                  auVar62._2_2_ = uVar48;
                  auVar62._0_2_ = uVar45;
                  uVar51 = (-1 < (short)uVar51) * uVar51;
                  auVar62._4_2_ = uVar51;
                  uVar54 = (-1 < (short)uVar54) * uVar54;
                  auVar62._6_2_ = uVar54;
                  uVar26 = (-1 < (short)uVar26) * uVar26;
                  auVar62._8_2_ = uVar26;
                  uVar57 = (-1 < (short)uVar57) * uVar57;
                  auVar62._10_2_ = uVar57;
                  uVar56 = (-1 < (short)uVar56) * uVar56;
                  auVar62._12_2_ = uVar56;
                  uVar55 = (-1 < (short)uVar55) * uVar55;
                  auVar62._14_2_ = uVar55;
                  *(undefined1 (*) [16])((long)*b_00 + lVar18) = auVar62;
                  piVar5 = ((ppVar10->field_4).rowcols)->score_row;
                  *(uint *)((long)piVar5 + lVar17) = (uint)uVar45;
                  *(uint *)((long)piVar5 + lVar16 * 4 + lVar17) = (uint)uVar48;
                  *(uint *)((long)piVar5 + lVar16 * 8 + lVar17) = (uint)uVar51;
                  *(uint *)((long)piVar5 + lVar16 * 0xc + lVar17) = (uint)uVar54;
                  *(uint *)((long)piVar5 + lVar16 * 0x10 + lVar17) = (uint)uVar26;
                  *(uint *)((long)piVar5 + lVar16 * 0x14 + lVar17) = (uint)uVar57;
                  *(uint *)((long)piVar5 + lVar16 * 0x18 + lVar17) = (uint)uVar56;
                  *(uint *)((long)piVar5 + lVar16 * 0x1c + lVar17) = (uint)uVar55;
                  uVar87 = ((short)uVar45 < (short)uVar87) * uVar45 |
                           ((short)uVar45 >= (short)uVar87) * uVar87;
                  uVar88 = ((short)uVar48 < (short)uVar88) * uVar48 |
                           ((short)uVar48 >= (short)uVar88) * uVar88;
                  uVar89 = ((short)uVar51 < (short)uVar89) * uVar51 |
                           ((short)uVar51 >= (short)uVar89) * uVar89;
                  uVar90 = ((short)uVar54 < (short)uVar90) * uVar54 |
                           ((short)uVar54 >= (short)uVar90) * uVar90;
                  uVar91 = ((short)uVar26 < (short)uVar91) * uVar26 |
                           ((short)uVar26 >= (short)uVar91) * uVar91;
                  uVar92 = ((short)uVar57 < (short)uVar92) * uVar57 |
                           ((short)uVar57 >= (short)uVar92) * uVar92;
                  uVar93 = ((short)uVar56 < (short)uVar93) * uVar56 |
                           ((short)uVar56 >= (short)uVar93) * uVar93;
                  uVar94 = ((short)uVar55 < (short)uVar94) * uVar55 |
                           ((short)uVar55 >= (short)uVar94) * uVar94;
                  uVar78 = ((short)uVar78 < (short)uVar45) * uVar45 |
                           ((short)uVar78 >= (short)uVar45) * uVar78;
                  uVar80 = ((short)uVar80 < (short)uVar48) * uVar48 |
                           ((short)uVar80 >= (short)uVar48) * uVar80;
                  uVar81 = ((short)uVar81 < (short)uVar51) * uVar51 |
                           ((short)uVar81 >= (short)uVar51) * uVar81;
                  uVar82 = ((short)uVar82 < (short)uVar54) * uVar54 |
                           ((short)uVar82 >= (short)uVar54) * uVar82;
                  uVar83 = ((short)uVar83 < (short)uVar26) * uVar26 |
                           ((short)uVar83 >= (short)uVar26) * uVar83;
                  uVar84 = ((short)uVar84 < (short)uVar57) * uVar57 |
                           ((short)uVar84 >= (short)uVar57) * uVar84;
                  uVar85 = ((short)uVar85 < (short)uVar56) * uVar56 |
                           ((short)uVar85 >= (short)uVar56) * uVar85;
                  uVar86 = ((short)uVar86 < (short)uVar55) * uVar55 |
                           ((short)uVar86 >= (short)uVar55) * uVar86;
                  uVar95 = ((short)uVar95 < (short)uVar45) * uVar45 |
                           ((short)uVar95 >= (short)uVar45) * uVar95;
                  uVar96 = ((short)uVar96 < (short)uVar48) * uVar48 |
                           ((short)uVar96 >= (short)uVar48) * uVar96;
                  uVar97 = ((short)uVar97 < (short)uVar51) * uVar51 |
                           ((short)uVar97 >= (short)uVar51) * uVar97;
                  uVar98 = ((short)uVar98 < (short)uVar54) * uVar54 |
                           ((short)uVar98 >= (short)uVar54) * uVar98;
                  uVar99 = ((short)uVar99 < (short)uVar26) * uVar26 |
                           ((short)uVar99 >= (short)uVar26) * uVar99;
                  uVar100 = ((short)uVar100 < (short)uVar57) * uVar57 |
                            ((short)uVar100 >= (short)uVar57) * uVar100;
                  uVar101 = ((short)uVar101 < (short)uVar56) * uVar56 |
                            ((short)uVar101 >= (short)uVar56) * uVar101;
                  uVar102 = ((short)uVar102 < (short)uVar55) * uVar55 |
                            ((short)uVar102 >= (short)uVar55) * uVar102;
                  lVar18 = lVar18 + 0x10;
                  lVar17 = lVar17 + (ulong)(uint)s2Len * 4;
                } while (lVar24 != lVar18);
                auVar42._0_2_ = -(ushort)((short)local_78 < (short)uVar95);
                auVar42._2_2_ = -(ushort)((short)uStack_76 < (short)uVar96);
                auVar42._4_2_ = -(ushort)((short)uVar29 < (short)uVar97);
                auVar42._6_2_ = -(ushort)((short)uVar47 < (short)uVar98);
                auVar42._8_2_ = -(ushort)((short)uVar50 < (short)uVar99);
                auVar42._10_2_ = -(ushort)((short)uVar53 < (short)uVar100);
                auVar42._12_2_ = -(ushort)((short)uVar66 < (short)uVar101);
                auVar42._14_2_ = -(ushort)((short)uVar67 < (short)uVar102);
                if ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar42 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar42 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar42 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar42 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar42 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar42 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar42 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar42 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar42 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar42 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar42._14_2_ >> 7 & 1) != 0) || (auVar42._14_2_ & 0x8000) != 0) {
                  uVar29 = ((short)uVar99 < (short)uVar95) * uVar95 |
                           ((short)uVar99 >= (short)uVar95) * uVar99;
                  uVar47 = ((short)uVar100 < (short)uVar96) * uVar96 |
                           ((short)uVar100 >= (short)uVar96) * uVar100;
                  uVar50 = ((short)uVar101 < (short)uVar97) * uVar97 |
                           ((short)uVar101 >= (short)uVar97) * uVar101;
                  uVar53 = ((short)uVar102 < (short)uVar98) * uVar98 |
                           ((short)uVar102 >= (short)uVar98) * uVar102;
                  sVar28 = (0 < (short)uVar99) * uVar99;
                  sVar60 = (0 < (short)uVar100) * uVar100;
                  sVar6 = (0 < (short)uVar101) * uVar101;
                  sVar58 = (0 < (short)uVar102) * uVar102;
                  uVar29 = ((short)uVar50 < (short)uVar29) * uVar29 |
                           ((short)uVar50 >= (short)uVar29) * uVar50;
                  uVar47 = ((short)uVar53 < (short)uVar47) * uVar47 |
                           ((short)uVar53 >= (short)uVar47) * uVar53;
                  uVar50 = (sVar28 < (short)uVar50) * uVar50 |
                           (ushort)(sVar28 >= (short)uVar50) * sVar28;
                  uVar53 = (sVar60 < (short)uVar53) * uVar53 |
                           (ushort)(sVar60 >= (short)uVar53) * sVar60;
                  uVar66 = (ushort)(sVar6 < sVar28) * sVar28 | (ushort)(sVar6 >= sVar28) * sVar6;
                  uVar67 = (ushort)(sVar58 < sVar60) * sVar60 | (ushort)(sVar58 >= sVar60) * sVar58;
                  sVar6 = (ushort)(0 < sVar6) * sVar6;
                  sVar58 = (ushort)(0 < sVar58) * sVar58;
                  auVar43._0_4_ =
                       CONCAT22(((short)uVar50 < (short)uVar47) * uVar47 |
                                ((short)uVar50 >= (short)uVar47) * uVar50,
                                ((short)uVar47 < (short)uVar29) * uVar29 |
                                ((short)uVar47 >= (short)uVar29) * uVar47);
                  auVar43._4_2_ =
                       ((short)uVar53 < (short)uVar50) * uVar50 |
                       ((short)uVar53 >= (short)uVar50) * uVar53;
                  auVar43._6_2_ =
                       ((short)uVar66 < (short)uVar53) * uVar53 |
                       ((short)uVar66 >= (short)uVar53) * uVar66;
                  auVar43._8_2_ =
                       ((short)uVar67 < (short)uVar66) * uVar66 |
                       ((short)uVar67 >= (short)uVar66) * uVar67;
                  auVar43._10_2_ =
                       (sVar6 < (short)uVar67) * uVar67 | (ushort)(sVar6 >= (short)uVar67) * sVar6;
                  auVar43._12_2_ =
                       (ushort)(sVar58 < sVar6) * sVar6 | (ushort)(sVar58 >= sVar6) * sVar58;
                  auVar43._14_2_ = (ushort)(0 < sVar58) * sVar58;
                  auVar32 = pshuflw(auVar43,auVar43,0);
                  memcpy(__dest,b_00,size << 4);
                  local_78 = auVar32._0_2_;
                  uStack_76 = auVar32._2_2_;
                  local_1ac = (int)uVar25;
                  uVar29 = local_78;
                  uVar47 = uStack_76;
                  uVar50 = local_78;
                  uVar53 = uStack_76;
                  uVar66 = local_78;
                  uVar67 = uStack_76;
                  local_1b0 = auVar43._0_4_;
                }
                uVar25 = uVar25 + 1;
                lVar22 = lVar22 + 4;
              } while (uVar25 != uVar11);
              sVar60 = (short)local_1b0;
              if ((uVar19 & 0x7ffffff8) != 0) {
                uVar19 = 0;
                do {
                  if ((*(short *)((long)*__dest + uVar19 * 2) == sVar60) &&
                     (uVar23 = ((uint)uVar19 & 7) * uVar20 + ((uint)(uVar19 >> 3) & 0x1fffffff),
                     (int)uVar23 < (int)uVar9)) {
                    uVar9 = (ulong)uVar23;
                  }
                  uVar23 = (uint)uVar9;
                  uVar19 = uVar19 + 1;
                } while ((uVar20 & 0xfffffff) << 3 != (int)uVar19);
              }
              auVar44._0_2_ = -(ushort)((short)uVar87 < (short)local_148);
              auVar44._2_2_ = -(ushort)((short)uVar88 < (short)uStack_146);
              auVar44._4_2_ = -(ushort)((short)uVar89 < (short)local_148);
              auVar44._6_2_ = -(ushort)((short)uVar90 < (short)uStack_146);
              auVar44._8_2_ = -(ushort)((short)uVar91 < (short)local_148);
              auVar44._10_2_ = -(ushort)((short)uVar92 < (short)uStack_146);
              auVar44._12_2_ = -(ushort)((short)uVar93 < (short)local_148);
              auVar44._14_2_ = -(ushort)((short)uVar94 < (short)uStack_146);
              auVar79._0_2_ = -(ushort)((short)local_c8 < (short)uVar78);
              auVar79._2_2_ = -(ushort)((short)uStack_c6 < (short)uVar80);
              auVar79._4_2_ = -(ushort)((short)local_c8 < (short)uVar81);
              auVar79._6_2_ = -(ushort)((short)uStack_c6 < (short)uVar82);
              auVar79._8_2_ = -(ushort)((short)local_c8 < (short)uVar83);
              auVar79._10_2_ = -(ushort)((short)uStack_c6 < (short)uVar84);
              auVar79._12_2_ = -(ushort)((short)local_c8 < (short)uVar85);
              auVar79._14_2_ = -(ushort)((short)uStack_c6 < (short)uVar86);
              auVar79 = auVar79 | auVar44;
              if ((((((((((((((((auVar79 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar79 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar79 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar79 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar79 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar79 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar79 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar79 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar79 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar79 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar79 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar79 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar79[0xf] < '\0') {
                *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                sVar60 = 0;
                local_1ac = 0;
                uVar23 = 0;
              }
              ppVar10->score = (int)sVar60;
              ppVar10->end_query = uVar23;
              ppVar10->end_ref = local_1ac;
              parasail_free(ptr_00);
              parasail_free(__dest);
              parasail_free(b_00);
              parasail_free(ptr);
              parasail_free(b);
              return ppVar10;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        vH = _mm_max_epi16(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            vH = _mm_max_epi16(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi16(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}